

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O1

int __thiscall gl4cts::SparseTexture2Tests::init(SparseTexture2Tests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  ShaderExtensionTestCase *this_00;
  TestNode *node;
  SparseTextureAllocationTestCase *this_01;
  SparseTextureCommitmentTestCase *pSVar2;
  undefined1 *puVar3;
  string local_48;
  
  this_00 = (ShaderExtensionTestCase *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"GL_ARB_sparse_texture2","");
  ShaderExtensionTestCase::ShaderExtensionTestCase(this_00,pCVar1,&local_48);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  node = (TestNode *)operator_new(0xc0);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)node,pCVar1->m_testCtx,"StandardPageSizesTestCase",
             "Verifies if values returned by GetInternalFormativ query matches Standard Virtual Page Sizes"
            );
  node[1]._vptr_TestNode = (_func_int **)pCVar1;
  node->_vptr_TestNode = (_func_int **)&PTR__StandardPageSizesTestCase_021283d0;
  node[1].m_testCtx = (TestContext *)0x0;
  node[1].m_name._M_dataplus._M_p = (pointer)0x0;
  node[1].m_name._M_string_length = 0;
  puVar3 = (undefined1 *)((long)&node[1].m_name.field_2 + 8);
  *(undefined4 *)((long)&node[1].m_name.field_2 + 8) = 0;
  node[1].m_description._M_dataplus._M_p = (pointer)0x0;
  node[1].m_description._M_string_length = (size_type)puVar3;
  node[1].m_description.field_2._M_allocated_capacity = (size_type)puVar3;
  *(undefined8 *)((long)&node[1].m_description.field_2 + 8) = 0;
  tcu::TestNode::addChild((TestNode *)this,node);
  this_01 = (SparseTextureAllocationTestCase *)operator_new(0x248);
  SparseTextureAllocationTestCase::SparseTextureAllocationTestCase
            (this_01,(this->super_TestCaseGroup).m_context,"SparseTexture2Allocation",
             "Verifies TexStorage* functionality added in CTS_ARB_sparse_texture2");
  (this_01->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SparseTextureAllocationTestCase_02128408;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  pSVar2 = (SparseTextureCommitmentTestCase *)operator_new(0x260);
  SparseTextureCommitmentTestCase::SparseTextureCommitmentTestCase
            (pSVar2,(this->super_TestCaseGroup).m_context,"SparseTexture2Commitment",
             "Verifies glTexPageCommitmentARB functionality added by ARB_sparse_texture2 extension")
  ;
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SparseTextureCommitmentTestCase_02128440;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (SparseTextureCommitmentTestCase *)operator_new(0x268);
  SparseTextureCommitmentTestCase::SparseTextureCommitmentTestCase
            (pSVar2,(this->super_TestCaseGroup).m_context,"UncommittedRegionsAccess",
             "Verifies if access to uncommitted regions of sparse texture works as expected");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SparseTextureCommitmentTestCase_021284d8;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (SparseTextureCommitmentTestCase *)operator_new(0x278);
  SparseTextureCommitmentTestCase::SparseTextureCommitmentTestCase
            (pSVar2,(this->super_TestCaseGroup).m_context,"SparseTexture2Lookup",
             "Verifies if sparse texture lookup functions for GLSL works as expected");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SparseTexture2LookupTestCase_02128570;
  pSVar2[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
  pSVar2[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
  pSVar2[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  return extraout_EAX;
}

Assistant:

void SparseTexture2Tests::init()
{
	addChild(new ShaderExtensionTestCase(m_context, "GL_ARB_sparse_texture2"));
	addChild(new StandardPageSizesTestCase(m_context));
	addChild(new SparseTexture2AllocationTestCase(m_context));
	addChild(new SparseTexture2CommitmentTestCase(m_context));
	addChild(new UncommittedRegionsAccessTestCase(m_context));
	addChild(new SparseTexture2LookupTestCase(m_context));
}